

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUnixMutex_Lock(PaUnixMutex *self)

{
  int iVar1;
  pthread_t __thread1;
  long errorCode;
  char *errorText;
  PaError local_14;
  PaError result;
  PaUnixMutex *self_local;
  
  local_14 = 0;
  paUtilErr_ = pthread_mutex_lock((pthread_mutex_t *)self);
  if (paUtilErr_ != 0) {
    __thread1 = pthread_self();
    iVar1 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar1 != 0) {
      errorCode = (long)paUtilErr_;
      errorText = strerror(paUtilErr_);
      PaUtil_SetLastHostErrorInfo(paALSA,errorCode,errorText);
    }
    PaUtil_DebugPrint(
                     "Expression \'pthread_mutex_lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/os/unix/pa_unix_util.c\', line: 527\n"
                     );
    local_14 = -9999;
  }
  return local_14;
}

Assistant:

PaError PaUnixMutex_Lock( PaUnixMutex* self )
{
    PaError result = paNoError;
    
#ifdef PTHREAD_CANCEL
	int oldState;
    PA_ENSURE_SYSTEM( pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, &oldState ), 0 );
#endif
    PA_ENSURE_SYSTEM( pthread_mutex_lock( &self->mtx ), 0 );

error:
    return result;
}